

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_shr_u8(c_v256 *__return_storage_ptr__,c_v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  c_v256 cVar8;
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [32];
  
  auVar10 = in_ZMM0._0_32_;
  if (c < 8) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64[3];
    auVar10 = vpmovzxbd_avx2(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a.u64[2];
    auVar11 = vpmovzxbd_avx2(auVar2);
    auVar5 = vpsrld_avx2(auVar10,ZEXT416(c));
    auVar6 = vpsrld_avx2(auVar11,ZEXT416(c));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = a.u64[0];
    auVar10 = vpmovzxbd_avx2(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = a.u64[1];
    auVar11 = vpmovzxbd_avx2(auVar4);
    auVar11 = vpsrld_avx2(auVar11,ZEXT416(c));
    auVar7 = vpsrld_avx2(auVar10,ZEXT416(c));
    auVar10 = vpackusdw_avx2(auVar6,auVar5);
    auVar11 = vpackusdw_avx2(auVar7,auVar11);
    auVar10 = vpermq_avx2(auVar10,0xd8);
    auVar11 = vpermq_avx2(auVar11,0xd8);
    auVar10 = vpackuswb_avx2(auVar11,auVar10);
    cVar8 = (c_v256)vpermq_avx2(auVar10,0xd8);
    *__return_storage_ptr__ = cVar8;
    return __return_storage_ptr__;
  }
  c_v256_shr_u8();
  uVar9 = 0xff >> ((byte)c & 0x1f);
  auVar11[0] = (undefined1)uVar9;
  auVar11[1] = auVar11[0];
  auVar11[2] = auVar11[0];
  auVar11[3] = auVar11[0];
  auVar11[4] = auVar11[0];
  auVar11[5] = auVar11[0];
  auVar11[6] = auVar11[0];
  auVar11[7] = auVar11[0];
  auVar11[8] = auVar11[0];
  auVar11[9] = auVar11[0];
  auVar11[10] = auVar11[0];
  auVar11[0xb] = auVar11[0];
  auVar11[0xc] = auVar11[0];
  auVar11[0xd] = auVar11[0];
  auVar11[0xe] = auVar11[0];
  auVar11[0xf] = auVar11[0];
  auVar11[0x10] = auVar11[0];
  auVar11[0x11] = auVar11[0];
  auVar11[0x12] = auVar11[0];
  auVar11[0x13] = auVar11[0];
  auVar11[0x14] = auVar11[0];
  auVar11[0x15] = auVar11[0];
  auVar11[0x16] = auVar11[0];
  auVar11[0x17] = auVar11[0];
  auVar11[0x18] = auVar11[0];
  auVar11[0x19] = auVar11[0];
  auVar11[0x1a] = auVar11[0];
  auVar11[0x1b] = auVar11[0];
  auVar11[0x1c] = auVar11[0];
  auVar11[0x1d] = auVar11[0];
  auVar11[0x1e] = auVar11[0];
  auVar11[0x1f] = auVar11[0];
  auVar10 = vpsrlw_avx2(auVar10,ZEXT416(c));
  vpand_avx2(auVar10,auVar11);
  return (c_v256 *)(ulong)uVar9;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shr_u8(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shr_u8(a.v128[1], c),
                          c_v128_shr_u8(a.v128[0], c));
}